

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_change_place(player *p,wchar_t place)

{
  short sVar1;
  level_conflict *plVar2;
  level_conflict *lev_00;
  char *pcVar3;
  level *next_lev;
  level *lev;
  wchar_t place_local;
  player *p_local;
  
  lev_00 = world->levels + p->place;
  if (p->last_place != p->place) {
    p->last_place = p->place;
  }
  if ((lev_00->locality == LOC_UNDERWORLD) || (lev_00->locality == LOC_MOUNTAIN_TOP)) {
    if (lev_00->up != (char *)0x0) {
      string_free(lev_00->up);
      lev_00->up = (char *)0x0;
    }
    if (lev_00->down != (char *)0x0) {
      string_free(lev_00->down);
      lev_00->down = (char *)0x0;
    }
    lev_00->depth = 0;
  }
  if ((p->upkeep->arena_level & 1U) == 0) {
    p->place = (int16_t)place;
  }
  else {
    p->place = 0;
    world->levels[p->place].depth = lev_00->depth;
  }
  plVar2 = world->levels;
  sVar1 = p->place;
  if (plVar2[sVar1].locality == LOC_UNDERWORLD) {
    pcVar3 = level_name(lev_00);
    pcVar3 = string_make(pcVar3);
    plVar2[sVar1].up = pcVar3;
    plVar2[sVar1].depth = lev_00->depth;
  }
  if (plVar2[sVar1].locality == LOC_MOUNTAIN_TOP) {
    pcVar3 = level_name(lev_00);
    pcVar3 = string_make(pcVar3);
    plVar2[sVar1].down = pcVar3;
    plVar2[sVar1].depth = lev_00->depth;
  }
  p->depth = (int16_t)world->levels[place].depth;
  lev_00->visited = true;
  if ((p->depth == 0) && (daycount != 0)) {
    store_update();
  }
  p->upkeep->generate_level = true;
  p->upkeep->autosave = true;
  return;
}

Assistant:

void player_change_place(struct player *p, int place)
{
	struct level *lev = &world->levels[p->place], *next_lev;

	/* Set last place (unless unchanged or arena) */
	if (p->last_place != p->place) {
		p->last_place = p->place;
	}

	/* Underworld and mountaintop levels need to be edited */
	if (lev->locality == LOC_UNDERWORLD || lev->locality == LOC_MOUNTAIN_TOP) {
		if (lev->up) {
			string_free(lev->up);
			lev->up = NULL;
		}
		if (lev->down) {
			string_free(lev->down);
			lev->down = NULL;
		}
		lev->depth = 0;
	}

	/* Set new place (unless arena) */
	if (!p->upkeep->arena_level) {
		p->place = place;
	} else {
		/* Arena is always 0 */
		p->place = 0;
		world->levels[p->place].depth = lev->depth; 
	}

	/* Underworld and mountaintop levels need to be edited */
	next_lev = &world->levels[p->place];
	if (next_lev->locality == LOC_UNDERWORLD) {
		next_lev->up = string_make(level_name(lev));
		next_lev->depth = lev->depth;
	}
	if (next_lev->locality == LOC_MOUNTAIN_TOP) {
		next_lev->down = string_make(level_name(lev));
		next_lev->depth = lev->depth;
	}

	p->depth = world->levels[place].depth;

	/* We've been here now */
	lev->visited = true;

	/* If we're returning to town, update the store contents
	   according to how long we've been away */
	if (!p->depth && daycount)
		store_update();

	/* Leaving, make new level */
	p->upkeep->generate_level = true;

	/* Save the game when we arrive on the new level. */
	p->upkeep->autosave = true;
}